

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 2MG.cpp
# Opt level: O1

int Storage::Disk::Disk2MG::open(char *__file,int __oflag,...)

{
  bool bVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  stat *psVar5;
  DiskImageHolder<Storage::Disk::MacintoshIMG> *this;
  undefined4 *puVar6;
  size_t in_RCX;
  uint32_t data_size;
  uint32_t data_start;
  vector<unsigned_char,_std::allocator<unsigned_char>_> creator;
  FileHolder file;
  uint32_t local_140;
  uint32_t local_13c;
  undefined1 local_138 [264];
  
  FileHolder::FileHolder((FileHolder *)(local_138 + 0x20),___oflag,ReadWrite);
  bVar1 = FileHolder::check_signature((FileHolder *)(local_138 + 0x20),"2IMG",0);
  if (!bVar1) {
    puVar6 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar6 = 0xfffffffe;
    __cxa_throw(puVar6,&Error::typeinfo,0);
  }
  FileHolder::read((FileHolder *)local_138,(int)local_138 + 0x20,(void *)0x4,in_RCX);
  uVar2 = FileHolder::get16le((FileHolder *)(local_138 + 0x20));
  uVar3 = FileHolder::get16le((FileHolder *)(local_138 + 0x20));
  uVar4 = FileHolder::get32le((FileHolder *)(local_138 + 0x20));
  FileHolder::get32le((FileHolder *)(local_138 + 0x20));
  FileHolder::seek((FileHolder *)(local_138 + 0x20),4,1);
  local_13c = FileHolder::get32le((FileHolder *)(local_138 + 0x20));
  local_140 = FileHolder::get32le((FileHolder *)(local_138 + 0x20));
  if ((local_140 == 0) && (*(int *)local_138._0_8_ == 0x464f4f57)) {
    psVar5 = FileHolder::stats((FileHolder *)(local_138 + 0x20));
    local_140 = (int)psVar5->st_size - (uint)uVar2;
  }
  if (0x3f < uVar2) {
    psVar5 = FileHolder::stats((FileHolder *)(local_138 + 0x20));
    if ((((long)(ulong)uVar2 < psVar5->st_size) && (uVar3 < 2)) && (uVar4 == 1)) {
      this = (DiskImageHolder<Storage::Disk::MacintoshIMG> *)operator_new(0x1d8);
      local_138._28_4_ = 0;
      DiskImageHolder<Storage::Disk::MacintoshIMG>::
      DiskImageHolder<std::__cxx11::string_const&,Storage::Disk::MacintoshIMG::FixedType,unsigned_int_const&,unsigned_int&>
                (this,___oflag,(FixedType *)(local_138 + 0x1c),&local_13c,&local_140);
      *(DiskImageHolder<Storage::Disk::MacintoshIMG> **)__file = this;
      __file[8] = '\x01';
      if ((FILE *)local_138._0_8_ != (FILE *)0x0) {
        operator_delete((void *)local_138._0_8_,local_138._16_8_ - local_138._0_8_);
      }
      FileHolder::~FileHolder((FileHolder *)(local_138 + 0x20));
      return (int)__file;
    }
  }
  puVar6 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar6 = 0xfffffffe;
  __cxa_throw(puVar6,&Error::typeinfo,0);
}

Assistant:

Disk2MG::DiskOrMassStorageDevice Disk2MG::open(const std::string &file_name) {
	FileHolder file(file_name);

	// Check the signature.
	if(!file.check_signature("2IMG")) throw Error::InvalidFormat;

	// Grab the creator, potential to fix the data size momentarily.
	const auto creator = file.read(4);

	// Grab the header size, version number and image format.
	const uint16_t header_size = file.get16le();
	const uint16_t version = file.get16le();
	const uint32_t format = file.get32le();
	const uint32_t flags = file.get32le();

	// Skip the number of ProDOS blocks; this is surely implicit from the data size?
	file.seek(4, SEEK_CUR);

	// Get the offset and size of the disk image data.
	const uint32_t data_start = file.get32le();
	uint32_t data_size = file.get32le();

	// Correct for the Sweet 16 emulator, which writes broken 2MGs.
	if(!data_size && !memcmp(creator.data(), "WOOF", 4)) {
		data_size = uint32_t(file.stats().st_size - header_size);
	}

	// Skipped:
	//
	//	four bytes, offset to comment
	//	four bytes, length of comment
	//	four bytes, offset to creator-specific data
	//	four bytes, length of creator-specific data
	//
	// (all of which relate to optional appendages).

	// Validate.
	if(header_size < 0x40 || header_size >= file.stats().st_size) {
		throw Error::InvalidFormat;
	}
	if(version > 1) {
		throw Error::InvalidFormat;
	}

	// TODO: based on format, instantiate a suitable disk image.
	switch(format) {
		default: throw Error::InvalidFormat;
		case 0:
			// TODO: DOS 3.3 sector order.
		break;
		case 1:
			// 'ProDOS order', which could still mean Macintosh-style (ie. not ProDOS, but whatever)
			// or Apple II-style. Try them both.
			try {
				return new DiskImageHolder<Storage::Disk::MacintoshIMG>(file_name, MacintoshIMG::FixedType::GCR, data_start, data_size);
			} catch(...) {}

			// TODO: Apple II-style.

			// Try a hard-disk image. For now this assumes: for an Apple IIe or GS.
			return new MassStorage::HDV(file_name, data_start, data_size);
		break;
		case 2:
			// TODO: NIB data (yuck!).
		break;
	}

	// So: maybe extend FileHolder to handle hiding the header before instantiating
	// a proper holder? Probably more valid than having each actual disk class do
	// its own range logic?
	(void)flags;

	throw Error::InvalidFormat;
	return nullptr;
}